

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerCallIDynamic(Lowerer *this,Instr *callInstr,ushort callFlags)

{
  LowererMDArch *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  undefined4 *puVar7;
  Opnd *this_01;
  RegOpnd *this_02;
  Instr *insertBeforeInstrForCFG;
  Instr *pIVar8;
  undefined1 *puVar9;
  
  bVar3 = Func::GetHasStackArgs(this->m_func);
  if (!bVar3) {
    puVar9 = (undefined1 *)__cxa_allocate_exception(1);
    *puVar9 = 0x24;
    __cxa_throw(puVar9,&Js::RejitException::typeinfo,0);
  }
  pOVar4 = IR::Instr::UnlinkSrc2(callInstr);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  bVar3 = StackSym::IsArgSlotSym(pSVar6);
  if ((!bVar3) || ((pSVar6->field_0x18 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5532,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar3) goto LAB_0054d010;
    *puVar7 = 0;
  }
  IR::Opnd::Free(&pSVar5->super_Opnd,this->m_func);
  pIVar8 = (pSVar6->field_5).m_instrDef;
  if (pIVar8->m_opcode != ArgOut_A_Dynamic) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5535,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic");
    if (!bVar3) goto LAB_0054d010;
    *puVar7 = 0;
  }
  IR::Instr::Unlink(pIVar8);
  IR::Instr::FreeDst(pIVar8);
  pOVar4 = IR::Instr::UnlinkSrc2(pIVar8);
  pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
  pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
  bVar3 = StackSym::IsArgSlotSym(pSVar6);
  if ((!bVar3) || ((pSVar6->field_0x18 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x553d,"(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef)",
                       "Arg tree not single def...");
    if (!bVar3) goto LAB_0054d010;
    *puVar7 = 0;
  }
  IR::Opnd::Free(&pSVar5->super_Opnd,this->m_func);
  pIVar1 = (pSVar6->field_5).m_instrDef;
  if (pIVar1->m_opcode != ArgOut_A_FromStackArgs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5540,"(argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)",
                       "argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs");
    if (!bVar3) goto LAB_0054d010;
    *puVar7 = 0;
  }
  this_00 = &(this->m_lowererMD).lowererMDArch;
  pOVar4 = LowererMDArch::GenerateArgOutForStackArgs(this_00,callInstr,pIVar1);
  this_01 = IR::Instr::UnlinkSrc2(pIVar1);
  this_02 = IR::Opnd::AsRegOpnd(this_01);
  pSVar6 = Sym::AsStackSym(&this_02->m_sym->super_Sym);
  IR::Opnd::Free(&this_02->super_Opnd,this->m_func);
  IR::Instr::Remove(pIVar1);
  pIVar1 = (pSVar6->field_5).m_instrDef;
  if (pIVar1->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x554a,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_0054d010:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  insertBeforeInstrForCFG = IR::Instr::GetNextRealInstr(pIVar1);
  IR::Instr::Remove(pIVar1);
  pIVar8 = LowererMDArch::LowerCallIDynamic
                     (this_00,callInstr,pIVar8,pOVar4,callFlags,insertBeforeInstrForCFG);
  return pIVar8;
}

Assistant:

IR::Instr *
Lowerer::LowerCallIDynamic(IR::Instr * callInstr, ushort callFlags)
{
    if (!this->m_func->GetHasStackArgs())
    {
        throw Js::RejitException(RejitReason::InlineApplyDisabled);
    }

    IR::Instr * insertBeforeInstrForCFG = nullptr;

    // Lower args and look for StartCall
    IR::Instr * argInstr = callInstr;
    IR::SymOpnd *   argLinkOpnd = argInstr->UnlinkSrc2()->AsSymOpnd();
    StackSym *      argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_Dynamic);

    IR::Instr* saveThisArgOutInstr = argInstr;
    saveThisArgOutInstr->Unlink();
    saveThisArgOutInstr->FreeDst();

    argLinkOpnd = argInstr->UnlinkSrc2()->AsSymOpnd();
    argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    AssertMsg(argLinkSym->IsArgSlotSym() && argLinkSym->m_isSingleDef, "Arg tree not single def...");
    argLinkOpnd->Free(this->m_func);
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);

    IR::Opnd* argsLength = m_lowererMD.GenerateArgOutForStackArgs(callInstr, argInstr);

    IR::RegOpnd* startCallDstOpnd = argInstr->UnlinkSrc2()->AsRegOpnd();
    argLinkSym  = startCallDstOpnd->m_sym->AsStackSym();
    startCallDstOpnd->Free(this->m_func);
    argInstr->Remove();// Remove ArgOut_A_FromStackArgs

    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::StartCall);
    insertBeforeInstrForCFG = argInstr->GetNextRealInstr();
    argInstr->Remove(); //Remove start call

    return m_lowererMD.LowerCallIDynamic(callInstr, saveThisArgOutInstr, argsLength, callFlags, insertBeforeInstrForCFG);
}